

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alc.cpp
# Opt level: O3

ALCchar * DevFmtTypeString(DevFmtType type)

{
  if (type < (DevFmtFloat|DevFmtUByte)) {
    return *(ALCchar **)(&DAT_001af120 + (ulong)type * 8);
  }
  return "(unknown type)";
}

Assistant:

const ALCchar *DevFmtTypeString(DevFmtType type) noexcept
{
    switch(type)
    {
    case DevFmtByte: return "Int8";
    case DevFmtUByte: return "UInt8";
    case DevFmtShort: return "Int16";
    case DevFmtUShort: return "UInt16";
    case DevFmtInt: return "Int32";
    case DevFmtUInt: return "UInt32";
    case DevFmtFloat: return "Float32";
    }
    return "(unknown type)";
}